

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void * cmCreateNewSourceFile(void *param_1)

{
  cmCPluginAPISourceFile *this;
  
  this = (cmCPluginAPISourceFile *)operator_new(0xb0);
  cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
  return this;
}

Assistant:

void * CCONV cmCreateNewSourceFile(void *)
{
  cmCPluginAPISourceFile *sf = new cmCPluginAPISourceFile;
  return (void*)sf;
}